

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall roundTrip_DebugTest_Test::TestBody(roundTrip_DebugTest_Test *this)

{
  bool bVar1;
  uint64_t uVar2;
  precise_unit *un;
  char *message;
  uint64_t in_RCX;
  precise_unit pVar3;
  AssertHelper local_d8;
  Message local_d0;
  unit local_c8;
  unit local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  undefined1 local_88 [8];
  precise_unit u2;
  string str;
  allocator local_41;
  string local_40;
  undefined1 local_20 [8];
  precise_unit u1;
  roundTrip_DebugTest_Test *this_local;
  
  u1._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"1*ampere90",&local_41);
  uVar2 = units::getDefaultFlags();
  pVar3 = units::unit_from_string(&local_40,uVar2);
  u1.multiplier_ = pVar3._8_8_;
  local_20 = (undefined1  [8])pVar3.multiplier_;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&u2.base_units_,(units *)local_20,un,in_RCX);
  std::__cxx11::string::string((string *)&gtest_ar.message_,(string *)&u2.base_units_);
  uVar2 = units::getDefaultFlags();
  pVar3 = units::unit_from_string((string *)&gtest_ar.message_,uVar2);
  u2.multiplier_ = pVar3._8_8_;
  local_88 = (undefined1  [8])pVar3.multiplier_;
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  local_c0 = units::unit_cast((precise_unit *)local_88);
  local_c8 = units::unit_cast((precise_unit *)local_20);
  testing::internal::EqHelper::Compare<units::unit,_units::unit,_nullptr>
            ((EqHelper *)local_b8,"unit_cast(u2)","unit_cast(u1)",&local_c0,&local_c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x3fb,message);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::__cxx11::string::~string((string *)&u2.base_units_);
  return;
}

Assistant:

TEST(roundTrip, DebugTest)
{
    auto u1 = unit_from_string("1*ampere90");
    auto str = to_string(u1);
    auto u2 = unit_from_string(str);
    EXPECT_EQ(unit_cast(u2), unit_cast(u1));
}